

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

CURLcode tool_setopt_offt(CURL *curl,GlobalConfig *global,char *name,CURLoption tag,curl_off_t lval)

{
  CURLcode CVar1;
  
  CVar1 = curl_easy_setopt(curl,tag,lval);
  if (((lval != 0) && (global->libcurl != (char *)0x0)) && (CVar1 == CURLE_OK)) {
    CVar1 = easysrc_addf(&easysrc_code,"curl_easy_setopt(hnd, %s, (curl_off_t)%ld);",name,lval);
    return CVar1;
  }
  return CVar1;
}

Assistant:

CURLcode tool_setopt_offt(CURL *curl, struct GlobalConfig *global,
                          const char *name, CURLoption tag,
                          curl_off_t lval)
{
  CURLcode ret = CURLE_OK;
  DEBUGASSERT((tag >= CURLOPTTYPE_OFF_T) && (tag < CURLOPTTYPE_BLOB));

  ret = curl_easy_setopt(curl, tag, lval);
  if(global->libcurl && !ret && lval) {
    /* we only use this for real if --libcurl was used */
    ret = easysrc_addf(&easysrc_code, "curl_easy_setopt(hnd, %s, (curl_off_t)%"
          CURL_FORMAT_CURL_OFF_T ");", name, lval);
  }

  return ret;
}